

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall wasm::OptimizeInstructions::visitIf(OptimizeInstructions *this,If *curr)

{
  uintptr_t uVar1;
  bool bVar2;
  Expression *pEVar3;
  Block *this_00;
  Drop *pDVar4;
  byte bVar5;
  Expression *right;
  MixedArena *this_01;
  optional<wasm::Type> type_;
  optional<wasm::Type> type;
  Builder local_190;
  Builder builder;
  bool local_b0;
  Expression *pEVar6;
  
  pEVar3 = optimizeBoolean(this,curr->condition);
  curr->condition = pEVar3;
  pEVar6 = curr->ifFalse;
  if (pEVar6 == (Expression *)0x0) {
    return;
  }
  right = pEVar6;
  if ((pEVar3->_id == UnaryId) && (*(int *)(pEVar3 + 1) == 0x14)) {
    pEVar3 = (Expression *)pEVar3[1].type.id;
    curr->condition = pEVar3;
    right = curr->ifTrue;
    curr->ifTrue = pEVar6;
    curr->ifFalse = right;
  }
  if (((pEVar3->type).id == 1) || (bVar2 = ExpressionAnalyzer::equal(curr->ifTrue,right), !bVar2)) {
    optimizeTernary<wasm::If>(this,curr);
    return;
  }
  pEVar6 = curr->condition;
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)&stack0xfffffffffffffe70,
             &((this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).super_Pass.runner)->options,
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule,pEVar6);
  bVar2 = true;
  if (local_b0 == false) {
    bVar2 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)&stack0xfffffffffffffe70);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&stack0xffffffffffffffa0);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&stack0xffffffffffffff70);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&stack0xffffffffffffff18);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&stack0xfffffffffffffee8);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&stack0xfffffffffffffeb8);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&stack0xfffffffffffffe88);
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id < 2) {
    local_190.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    if (bVar2 == false) {
      this_00 = (Block *)curr->ifTrue;
      goto LAB_009cd999;
    }
  }
  else {
    this_00 = (Block *)curr->ifTrue;
    uVar1 = (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
    local_190.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    bVar5 = uVar1 == 1 | bVar2;
    pEVar6 = (Expression *)CONCAT71((int7)((ulong)pEVar6 >> 8),bVar5);
    if (bVar5 == 0) goto LAB_009cd999;
    if (uVar1 == 1) {
      this_01 = &(local_190.wasm)->allocator;
      this_00 = (Block *)MixedArena::allocSpace(this_01,0x40,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (this_00->name).super_IString.str._M_len = 0;
      (this_00->name).super_IString.str._M_str = (char *)0x0;
      (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      (this_00->list).allocator = this_01;
      if (bVar2 != false) {
        pDVar4 = Builder::makeDrop(&stack0xfffffffffffffe70,curr->condition);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(this_00->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pDVar4);
      }
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(this_00->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 curr->ifTrue);
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)
           (curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id;
      Block::finalize(this_00,type_,Unknown);
      goto LAB_009cd999;
    }
  }
  pEVar3 = curr->condition;
  pDVar4 = (Drop *)MixedArena::allocSpace(&(local_190.wasm)->allocator,0x18,8);
  (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
  (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
  pDVar4->value = pEVar3;
  Drop::finalize(pDVar4);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar6;
  this_00 = Builder::makeSequence(&stack0xfffffffffffffe70,(Expression *)pDVar4,curr->ifTrue,type);
LAB_009cd999:
  replaceCurrent(this,(Expression *)this_00);
  return;
}

Assistant:

void visitIf(If* curr) {
    curr->condition = optimizeBoolean(curr->condition);
    if (curr->ifFalse) {
      if (auto* unary = curr->condition->dynCast<Unary>()) {
        if (unary->op == EqZInt32) {
          // flip if-else arms to get rid of an eqz
          curr->condition = unary->value;
          std::swap(curr->ifTrue, curr->ifFalse);
        }
      }
      if (curr->condition->type != Type::unreachable &&
          ExpressionAnalyzer::equal(curr->ifTrue, curr->ifFalse)) {
        // The sides are identical, so fold. If we can replace the If with one
        // arm and there are no side effects in the condition, replace it. But
        // make sure not to change a concrete expression to an unreachable
        // expression because we want to avoid having to refinalize.
        bool needCondition = effects(curr->condition).hasSideEffects();
        bool wouldBecomeUnreachable =
          curr->type.isConcrete() && curr->ifTrue->type == Type::unreachable;
        Builder builder(*getModule());
        if (!wouldBecomeUnreachable && !needCondition) {
          return replaceCurrent(curr->ifTrue);
        } else if (!wouldBecomeUnreachable) {
          return replaceCurrent(builder.makeSequence(
            builder.makeDrop(curr->condition), curr->ifTrue));
        } else {
          // Emit a block with the original concrete type.
          auto* ret = builder.makeBlock();
          if (needCondition) {
            ret->list.push_back(builder.makeDrop(curr->condition));
          }
          ret->list.push_back(curr->ifTrue);
          ret->finalize(curr->type);
          return replaceCurrent(ret);
        }
      }
      optimizeTernary(curr);
    }
  }